

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlXPathObjectPtr xmlXPathNewBoolean(int val)

{
  xmlXPathObjectPtr ret;
  xmlXPathObjectPtr pxStack_10;
  int val_local;
  
  pxStack_10 = (xmlXPathObjectPtr)(*xmlMalloc)(0x48);
  if (pxStack_10 == (xmlXPathObjectPtr)0x0) {
    xmlXPathErrMemory((xmlXPathContextPtr)0x0,"creating boolean object\n");
    pxStack_10 = (xmlXPathObjectPtr)0x0;
  }
  else {
    memset(pxStack_10,0,0x48);
    pxStack_10->type = XPATH_BOOLEAN;
    pxStack_10->boolval = (uint)(val != 0);
  }
  return pxStack_10;
}

Assistant:

xmlXPathObjectPtr
xmlXPathNewBoolean(int val) {
    xmlXPathObjectPtr ret;

    ret = (xmlXPathObjectPtr) xmlMalloc(sizeof(xmlXPathObject));
    if (ret == NULL) {
        xmlXPathErrMemory(NULL, "creating boolean object\n");
	return(NULL);
    }
    memset(ret, 0 , (size_t) sizeof(xmlXPathObject));
    ret->type = XPATH_BOOLEAN;
    ret->boolval = (val != 0);
#ifdef XP_DEBUG_OBJ_USAGE
    xmlXPathDebugObjUsageRequested(NULL, XPATH_BOOLEAN);
#endif
    return(ret);
}